

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O2

void uprv_sortArray_63(void *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                      UBool sortStable,UErrorCode *pErrorCode)

{
  UAlignedMemory *pv;
  UAlignedMemory *px;
  UAlignedMemory v [26];
  
  pv = v;
  px = v;
  if (pErrorCode == (UErrorCode *)0x0) {
    return;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if ((((cmp == (UComparator *)0x0) || (itemSize < 1)) || (length < 0)) ||
     (array == (void *)0x0 && 0 < length)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if ((uint)length < 2) {
    return;
  }
  if ((uint)length < 9 || sortStable != '\0') {
    if ((200 < (uint)itemSize) &&
       (pv = (UAlignedMemory *)uprv_malloc_63((ulong)(uint)itemSize), pv == (UAlignedMemory *)0x0))
    {
LAB_0028fe69:
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    doInsertionSort((char *)array,length,itemSize,cmp,context,pv);
    if (pv == v) {
      return;
    }
  }
  else {
    if ((200 < (uint)itemSize) &&
       (px = (UAlignedMemory *)uprv_malloc_63((ulong)(uint)(itemSize * 2)),
       px == (UAlignedMemory *)0x0)) goto LAB_0028fe69;
    subQuickSort((char *)array,0,length,itemSize,cmp,context,px,
                 (undefined1 *)((long)px + (ulong)(uint)itemSize));
    pv = px;
    if (px == v) {
      return;
    }
  }
  uprv_free_63(pv);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_sortArray(void *array, int32_t length, int32_t itemSize,
               UComparator *cmp, const void *context,
               UBool sortStable, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }
    if((length>0 && array==NULL) || length<0 || itemSize<=0 || cmp==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(length<=1) {
        return;
    } else if(length<MIN_QSORT || sortStable) {
        insertionSort((char *)array, length, itemSize, cmp, context, pErrorCode);
    } else {
        quickSort((char *)array, length, itemSize, cmp, context, pErrorCode);
    }
}